

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O3

void __thiscall bloaty::Options::InternalSwap(Options *this,Options *other)

{
  ArenaStringPtr *pAVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  int32 iVar5;
  void *pvVar6;
  uint64 uVar7;
  int64 iVar8;
  UnknownFieldSet *other_00;
  string *psVar9;
  
  pvVar6 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar6 & 1) != 0) {
LAB_00186471:
      other_00 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
      goto LAB_00186475;
    }
  }
  else {
    if (((ulong)pvVar6 & 1) != 0) goto LAB_00186471;
    other_00 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
LAB_00186475:
    google::protobuf::internal::InternalMetadataWithArena::DoSwap
              (&this->_internal_metadata_,other_00);
  }
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->filename_).super_RepeatedPtrFieldBase,
             &(other->filename_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->base_filename_).super_RepeatedPtrFieldBase,
             &(other->base_filename_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->data_source_).super_RepeatedPtrFieldBase,
             &(other->data_source_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->custom_data_source_).super_RepeatedPtrFieldBase,
             &(other->custom_data_source_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->debug_filename_).super_RepeatedPtrFieldBase,
             &(other->debug_filename_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->source_map_).super_RepeatedPtrFieldBase,
             &(other->source_map_).super_RepeatedPtrFieldBase);
  pAVar1 = &other->disassemble_function_;
  psVar9 = (this->disassemble_function_).ptr_;
  if (psVar9 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar1->ptr_ != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
       ) {
      google::protobuf::internal::ArenaStringPtr::CreateInstance
                (&this->disassemble_function_,(Arena *)0x0,
                 (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
      psVar9 = (this->disassemble_function_).ptr_;
      goto LAB_0018651c;
    }
  }
  else {
LAB_0018651c:
    if (pAVar1->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
       ) {
      google::protobuf::internal::ArenaStringPtr::CreateInstance
                (pAVar1,(Arena *)0x0,
                 (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
    }
    std::__cxx11::string::swap((string *)psVar9);
  }
  pAVar1 = &other->source_filter_;
  psVar9 = (this->source_filter_).ptr_;
  if (psVar9 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    if (pAVar1->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
       ) goto LAB_001865aa;
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (&this->source_filter_,(Arena *)0x0,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
    psVar9 = (this->source_filter_).ptr_;
  }
  if (pAVar1->ptr_ == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
  {
    google::protobuf::internal::ArenaStringPtr::CreateInstance
              (pAVar1,(Arena *)0x0,
               (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar9);
LAB_001865aa:
  iVar4 = this->demangle_;
  this->demangle_ = other->demangle_;
  other->demangle_ = iVar4;
  iVar4 = this->sort_by_;
  this->sort_by_ = other->sort_by_;
  other->sort_by_ = iVar4;
  iVar5 = this->verbose_level_;
  this->verbose_level_ = other->verbose_level_;
  other->verbose_level_ = iVar5;
  bVar2 = this->dump_raw_map_;
  this->dump_raw_map_ = other->dump_raw_map_;
  other->dump_raw_map_ = bVar2;
  uVar7 = this->debug_vmaddr_;
  this->debug_vmaddr_ = other->debug_vmaddr_;
  other->debug_vmaddr_ = uVar7;
  uVar7 = this->debug_fileoff_;
  this->debug_fileoff_ = other->debug_fileoff_;
  other->debug_fileoff_ = uVar7;
  iVar8 = this->max_rows_per_level_;
  this->max_rows_per_level_ = other->max_rows_per_level_;
  other->max_rows_per_level_ = iVar8;
  return;
}

Assistant:

void Options::InternalSwap(Options* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  filename_.InternalSwap(&other->filename_);
  base_filename_.InternalSwap(&other->base_filename_);
  data_source_.InternalSwap(&other->data_source_);
  custom_data_source_.InternalSwap(&other->custom_data_source_);
  debug_filename_.InternalSwap(&other->debug_filename_);
  source_map_.InternalSwap(&other->source_map_);
  disassemble_function_.Swap(&other->disassemble_function_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  source_filter_.Swap(&other->source_filter_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(demangle_, other->demangle_);
  swap(sort_by_, other->sort_by_);
  swap(verbose_level_, other->verbose_level_);
  swap(dump_raw_map_, other->dump_raw_map_);
  swap(debug_vmaddr_, other->debug_vmaddr_);
  swap(debug_fileoff_, other->debug_fileoff_);
  swap(max_rows_per_level_, other->max_rows_per_level_);
}